

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShmSystemV.cpp
# Opt level: O0

void __thiscall adios2::transport::ShmSystemV::~ShmSystemV(ShmSystemV *this)

{
  Transport *in_RDI;
  
  in_RDI->_vptr_Transport = (_func_int **)&PTR__ShmSystemV_01136920;
  if (((in_RDI->m_IsOpen & 1U) != 0) &&
     (shmdt(*(void **)&in_RDI[1].m_Library), (in_RDI[1].m_Library.field_2._M_local_buf[0] & 1U) != 0
     )) {
    shmctl(*(int *)((long)&in_RDI[1].m_Type.field_2 + 0xc),0,(shmid_ds *)0x0);
  }
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  Transport::~Transport(in_RDI);
  return;
}

Assistant:

ShmSystemV::~ShmSystemV() // this might not be correct
{
    if (m_IsOpen)
    {
        shmdt(m_Buffer);

        if (m_RemoveAtClose)
        {
            shmctl(m_ShmID, IPC_RMID, NULL);
        }
    }
}